

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O0

void PrintEphemeris(CEObservation *obs,double *duration,double *step_size)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  double dVar7;
  CEDate *pCVar8;
  CEBody *pCVar9;
  reference pvVar10;
  undefined8 uVar11;
  double *in_RDX;
  double *in_RSI;
  CEObservation *in_RDI;
  double dVar12;
  double dVar13;
  double dVar14;
  int s;
  CESkyCoord appar_coords;
  CESkyCoord obs_coords;
  int max_steps;
  vector<double,_std::allocator<double>_> dec;
  vector<double,_std::allocator<double>_> ra;
  vector<double,_std::allocator<double>_> lat_dms;
  vector<double,_std::allocator<double>_> lon_dms;
  vector<double,_std::allocator<double>_> localtime;
  CEObserver *observer;
  CEPlanet *planet;
  CEDate *date;
  CEBody *in_stack_fffffffffffffac8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffad8;
  CEDate *in_stack_fffffffffffffae0;
  CESkyCoord *in_stack_fffffffffffffae8;
  CEPlanet *local_388;
  undefined4 local_374;
  double local_370;
  CEDate local_368 [64];
  CEAngle local_328 [16];
  CEDate local_318 [64];
  CEAngle local_2d8 [16];
  double local_2c8;
  CEDate local_2c0 [64];
  CEAngle local_280 [40];
  CEDate local_258 [64];
  CEAngle local_218 [40];
  CEDate local_1f0 [52];
  undefined4 local_1bc;
  double local_1b8;
  CEAngle local_1b0 [16];
  double local_1a0;
  CEAngle local_198 [20];
  int local_184;
  CESkyCoord local_180 [48];
  CESkyCoord local_150 [52];
  int local_11c;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_100;
  string local_e8 [32];
  double local_c8;
  CEAngle local_c0 [16];
  vector<double,_std::allocator<double>_> local_b0;
  double local_88;
  CEAngle local_80 [16];
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  undefined8 local_50;
  vector<double,_std::allocator<double>_> local_48;
  CEObserver *local_30;
  CEPlanet *local_28;
  CEDate *local_20;
  double *local_18;
  double *local_10;
  CEObservation *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = CEObservation::Date(in_RDI);
  pCVar9 = CEObservation::Body(local_8);
  if (pCVar9 == (CEBody *)0x0) {
    local_388 = (CEPlanet *)0x0;
  }
  else {
    local_388 = (CEPlanet *)__dynamic_cast(pCVar9,&CEBody::typeinfo,&CEPlanet::typeinfo,0);
  }
  local_28 = local_388;
  local_30 = CEObservation::Observer(local_8);
  pCVar8 = local_20;
  local_58 = CEObserver::UTCOffset(local_30);
  local_50 = (**(code **)(*(long *)pCVar8 + 0x48))(pCVar8,&local_58);
  CETime::TimeDbl2Vect((double *)&local_48);
  local_88 = CEObserver::Longitude_Rad(local_30);
  CEAngle::CEAngle(local_80,&local_88);
  CEAngle::DmsVect();
  CEAngle::~CEAngle(local_80);
  local_c8 = CEObserver::Latitude_Rad(local_30);
  CEAngle::CEAngle(local_c0,&local_c8);
  CEAngle::DmsVect();
  CEAngle::~CEAngle(local_c0);
  printf("\n");
  printf("= OBSERVER ===================\n");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,0);
  dVar12 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,1);
  dVar1 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,2);
  dVar2 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,3);
  printf("  Longitude: %+4dd %02dm %4.1fs\n",dVar2 + *pvVar10,(ulong)(uint)(int)dVar12,
         (ulong)(uint)(int)dVar1);
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,0);
  dVar12 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,1);
  dVar1 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,2);
  dVar2 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,3);
  printf("  Latitude :  %+3dd %02dm %4.1fs\n",dVar2 + *pvVar10,(ulong)(uint)(int)dVar12,
         (ulong)(uint)(int)dVar1);
  dVar12 = CEObserver::Elevation_m(local_30);
  printf("  Elevation: %f m \n",dVar12);
  dVar12 = CEObserver::Pressure_hPa(local_30);
  printf("  Pressure : %f hPa\n",dVar12);
  dVar12 = CEObserver::Temperature_C(local_30);
  printf("  Temp     : %f Celsius\n",dVar12);
  dVar12 = CEObserver::RelativeHumidity(local_30);
  printf("  Humidity : %f %%\n",dVar12 * 100.0);
  dVar12 = CEObserver::Wavelength_um(local_30);
  printf("  Wavelen. : %f micrometers\n",dVar12);
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,0);
  dVar12 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,1);
  dVar1 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,2);
  dVar2 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,3);
  printf("  LocalTime: %02d:%02d:%04.1f\n",dVar2 + *pvVar10,(ulong)(uint)(int)dVar12,
         (ulong)(uint)(int)dVar1);
  dVar12 = CEObserver::UTCOffset(local_30);
  printf("  UTCOffset: %2d hrs\n\n",(ulong)(uint)(int)dVar12);
  printf("= PLANET =====================\n");
  CEBody::Name_abi_cxx11_(in_stack_fffffffffffffac8);
  uVar11 = std::__cxx11::string::c_str();
  printf("  Name  : %s\n",uVar11);
  std::__cxx11::string::~string(local_e8);
  dVar12 = CEPlanet::Mass_kg(local_28);
  printf("  Mass  : %e kg\n",dVar12);
  dVar12 = CEPlanet::Radius_m(local_28);
  printf("  Radius: %f km\n",dVar12 / 1000.0);
  dVar12 = CEPlanet::Albedo(local_28);
  printf("  Albedo: %f\n\n",dVar12);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x124fa9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x124fb6);
  printf("= NOTES ======================\n");
  printf("  * RA,DEC represent apparent ICRS coordinates for the observer\n");
  printf("  * Coordinates should be considered dubious at small altitudes\n");
  printf("\n");
  printf("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  \n");
  printf(" =======================================================================\n");
  local_11c = (int)(*local_10 / *local_18);
  CESkyCoord::CESkyCoord(local_150);
  CESkyCoord::CESkyCoord(local_180);
  for (local_184 = 0; local_184 <= local_11c; local_184 = local_184 + 1) {
    local_1a0 = (double)(**(code **)(*(long *)local_8 + 0x28))();
    CEAngle::CEAngle(local_198,&local_1a0);
    local_1b8 = (double)(**(code **)(*(long *)local_8 + 0x38))();
    CEAngle::CEAngle(local_1b0,&local_1b8);
    local_1bc = 3;
    CESkyCoord::SetCoordinates((CEAngle *)local_150,local_198,(CESkyCoordType *)local_1b0);
    CEAngle::~CEAngle(local_1b0);
    CEAngle::~CEAngle(local_198);
    CESkyCoord::ConvertToICRS(local_1f0,(CEObserver *)local_150);
    CESkyCoord::operator=(local_180,(CESkyCoord *)local_1f0);
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_1f0);
    dVar12 = CppEphem::julian_date_J2000();
    CEDate::CEDate(local_258,dVar12,JD);
    CESkyCoord::XCoord(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    CEAngle::HmsVect();
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
    CEAngle::~CEAngle(local_218);
    CEDate::~CEDate(local_258);
    dVar12 = CppEphem::julian_date_J2000();
    CEDate::CEDate(local_2c0,dVar12,JD);
    CESkyCoord::YCoord(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    CEAngle::DmsVect();
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
    CEAngle::~CEAngle(local_280);
    CEDate::~CEDate(local_2c0);
    dVar13 = CEDate::operator_cast_to_double(local_20);
    pCVar8 = local_20;
    local_2c8 = CEObserver::UTCOffset(local_30);
    uVar11 = (**(code **)(*(long *)pCVar8 + 0x48))(pCVar8,&local_2c8);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_100,0);
    vVar3 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_100,1);
    vVar4 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_100,2);
    dVar12 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_100,3);
    dVar1 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_118,0);
    vVar5 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_118,1);
    vVar6 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_118,2);
    dVar2 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_118,3);
    dVar7 = *pvVar10;
    dVar14 = CppEphem::julian_date_J2000();
    CEDate::CEDate(local_318,dVar14,JD);
    CESkyCoord::XCoord(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    CEAngle::Deg();
    dVar14 = CppEphem::julian_date_J2000();
    CEDate::CEDate(local_368,dVar14,JD);
    CESkyCoord::YCoord(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    CEAngle::Deg();
    printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",dVar13,
           uVar11,vVar3,vVar4,dVar12 + dVar1,vVar5,vVar6,dVar2 + dVar7);
    CEAngle::~CEAngle(local_328);
    CEDate::~CEDate(local_368);
    CEAngle::~CEAngle(local_2d8);
    CEDate::~CEDate(local_318);
    in_stack_fffffffffffffae0 = local_20;
    in_stack_fffffffffffffae8 = (CESkyCoord *)(**(code **)(*(long *)local_20 + 0x20))();
    local_370 = (double)in_stack_fffffffffffffae8 + *local_18 / 1440.0;
    local_374 = 0;
    (**(code **)(*(long *)in_stack_fffffffffffffae0 + 0x10))
              (in_stack_fffffffffffffae0,&local_370,&local_374);
  }
  printf(" -------------------------------------------------------------------\n");
  CESkyCoord::~CESkyCoord(local_180);
  CESkyCoord::~CESkyCoord(local_150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
  return;
}

Assistant:

void PrintEphemeris(CEObservation& obs, 
                    const double&  duration, 
                    const double&  step_size)
{
    // Lets get the objects in obs
    CEDate* date = obs.Date();
    CEPlanet* planet = dynamic_cast<CEPlanet*>( obs.Body() );
    CEObserver* observer = obs.Observer();
    std::vector<double> localtime = CETime::TimeDbl2Vect(date->GetTime(observer->UTCOffset()));
    
    // Print some information about the observer
    std::vector<double> lon_dms = CEAngle(observer->Longitude_Rad()).DmsVect();
    std::vector<double> lat_dms = CEAngle(observer->Latitude_Rad()).DmsVect();

    std::printf("\n") ;
    std::printf("= OBSERVER ===================\n");
    std::printf("  Longitude: %+4dd %02dm %4.1fs\n", int(lon_dms[0]), int(lon_dms[1]), lon_dms[2]+lon_dms[3]);
    std::printf("  Latitude :  %+3dd %02dm %4.1fs\n", int(lat_dms[0]), int(lat_dms[1]), lat_dms[2]+lat_dms[3]);
    std::printf("  Elevation: %f m \n", observer->Elevation_m());
    std::printf("  Pressure : %f hPa\n", observer->Pressure_hPa());
    std::printf("  Temp     : %f Celsius\n", observer->Temperature_C());
    std::printf("  Humidity : %f %%\n", 100.0*observer->RelativeHumidity());
    std::printf("  Wavelen. : %f micrometers\n", observer->Wavelength_um());
    std::printf("  LocalTime: %02d:%02d:%04.1f\n", int(localtime[0]), int(localtime[1]), localtime[2]+localtime[3]);
    std::printf("  UTCOffset: %2d hrs\n\n", int(observer->UTCOffset()));

    // Print some basic information regarding the planet itself
    std::printf("= PLANET =====================\n");
    std::printf("  Name  : %s\n", planet->Name().c_str());
    std::printf("  Mass  : %e kg\n", planet->Mass_kg());
    std::printf("  Radius: %f km\n", planet->Radius_m()/1000.0);
    std::printf("  Albedo: %f\n\n", planet->Albedo());
    
    std::vector<double> ra;
    std::vector<double> dec;
    
    // Now do the stuff we actually want
    std::printf("= NOTES ======================\n");
    std::printf("  * RA,DEC represent apparent ICRS coordinates for the observer\n");
    std::printf("  * Coordinates should be considered dubious at small altitudes\n");
    std::printf("\n");
    std::printf("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  \n") ;
    std::printf(" =======================================================================\n") ;
    int max_steps = int(duration/step_size);
    CESkyCoord obs_coords;
    CESkyCoord appar_coords;
    for (int s=0; s<=max_steps; s++) {

        // Get the observed coordinates
        obs_coords.SetCoordinates(obs.GetAzimuth_Rad(), obs.GetZenith_Rad(),
                                  CESkyCoordType::OBSERVED);
        // Convert to RA,DEC
        appar_coords = obs_coords.ConvertToICRS(*date, *observer);
        // Update the coordiantes of the planet
        ra  = appar_coords.XCoord().HmsVect();
        dec = appar_coords.YCoord().DmsVect();
        
        std::printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
                    double(*date), date->GetTime(observer->UTCOffset()),
                    ra[0], ra[1], ra[2] + ra[3],
                    dec[0], dec[1], dec[2] + dec[3],
                    obs_coords.XCoord().Deg(),
                    90.0-obs_coords.YCoord().Deg());
        
        // Update the date
        date->SetDate(date->JD() + step_size/(60.0*24.0), CEDateType::JD);
    }
    
    std::printf(" -------------------------------------------------------------------\n");
}